

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc,string *config)

{
  cmMakefileTargetGenerator *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  string *filename;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view source_00;
  string_view source_01;
  string output;
  string copyEcho;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_138;
  string local_118;
  string macdir;
  string copyCommand;
  string local_b8;
  size_type local_98;
  pointer local_90;
  size_type local_88;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_50 [32];
  
  bVar3 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar3) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory
              (&macdir,(this->Generator->OSXBundleGenerator)._M_t.
                       super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
                       .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,
               config);
    filename = cmSourceFile::GetFullPath_abi_cxx11_(source);
    _Var2 = macdir._M_dataplus;
    local_50[0] = 0x2f;
    cmsys::SystemTools::GetFilenameName(&copyEcho,filename);
    local_b8._M_dataplus._M_p = (pointer)macdir._M_string_length;
    local_b8._M_string_length = (size_type)_Var2._M_p;
    local_b8.field_2._M_allocated_capacity = 1;
    local_98 = copyEcho._M_string_length;
    local_90 = copyEcho._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)&local_b8;
    local_b8.field_2._8_8_ = local_50;
    cmCatViews_abi_cxx11_(&output,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != &copyEcho.field_2) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->Generator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_b8,
               &(pcVar1->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&output);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->CleanFiles,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    cmOutputConverter::MaybeRelativeToTopBinDir
              (&local_b8,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,&output);
    std::__cxx11::string::operator=((string *)&output,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,filename);
    local_b8._M_dataplus._M_p = (pointer)0x15;
    local_b8._M_string_length = 0x6c3eca;
    local_b8.field_2._M_allocated_capacity = output._M_string_length;
    local_b8.field_2._8_8_ = output._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_b8;
    cmCatViews_abi_cxx11_(&copyEcho,views_00);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this->Generator->LocalGenerator,&commands,&copyEcho,EchoBuild,(EchoProgress *)0x0);
    source_00._M_str = (filename->_M_dataplus)._M_p;
    source_00._M_len = filename->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_118,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,source_00,SHELL);
    _Var2._M_p = local_118._M_dataplus._M_p;
    source_01._M_str = output._M_dataplus._M_p;
    source_01._M_len = output._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_138,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,source_01,SHELL);
    local_b8._M_dataplus._M_p = (pointer)0x19;
    local_b8._M_string_length = 0x6c3ee0;
    local_b8.field_2._M_allocated_capacity = local_118._M_string_length;
    local_b8.field_2._8_8_ = _Var2._M_p;
    local_50[0] = 0x20;
    local_98 = 1;
    local_88 = local_138._M_string_length;
    local_80 = local_138._M_dataplus._M_p;
    views_01._M_len = 4;
    views_01._M_array = (iterator)&local_b8;
    local_90 = local_50;
    cmCatViews_abi_cxx11_(&copyCommand,views_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &copyCommand);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->Generator->LocalGenerator,
               (ostream *)
               (this->Generator->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
               &output,&depends,&commands,false,false);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Generator->ExtraFiles,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyCommand._M_dataplus._M_p != &copyCommand.field_2) {
      operator_delete(copyCommand._M_dataplus._M_p,copyCommand.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != &copyEcho.field_2) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != &output.field_2) {
      operator_delete(output._M_dataplus._M_p,output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)macdir._M_dataplus._M_p != &macdir.field_2) {
      operator_delete(macdir._M_dataplus._M_p,macdir.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc, const std::string& config)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc,
                                                                    config);

  // Get the input file location.
  std::string const& input = source.GetFullPath();

  // Get the output file location.
  std::string output =
    cmStrCat(macdir, '/', cmSystemTools::GetFilenameName(input));
  this->Generator->CleanFiles.insert(
    this->Generator->LocalGenerator->MaybeRelativeToCurBinDir(output));
  output = this->Generator->LocalGenerator->MaybeRelativeToTopBinDir(output);

  // Create a rule to copy the content into the bundle.
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  depends.push_back(input);
  std::string copyEcho = cmStrCat("Copying OS X content ", output);
  this->Generator->LocalGenerator->AppendEcho(
    commands, copyEcho, cmLocalUnixMakefileGenerator3::EchoBuild);
  std::string copyCommand =
    cmStrCat("$(CMAKE_COMMAND) -E copy ",
             this->Generator->LocalGenerator->ConvertToOutputFormat(
               input, cmOutputConverter::SHELL),
             ' ',
             this->Generator->LocalGenerator->ConvertToOutputFormat(
               output, cmOutputConverter::SHELL));
  commands.push_back(std::move(copyCommand));
  this->Generator->LocalGenerator->WriteMakeRule(
    *this->Generator->BuildFileStream, nullptr, output, depends, commands,
    false);
  this->Generator->ExtraFiles.insert(output);
}